

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O2

void __thiscall
anon_unknown.dwarf_63e435::ThrowingErrorReporter::addError
          (ThrowingErrorReporter *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  Fault f;
  uint32_t endByte_local;
  uint32_t startByte_local;
  Array<char> local_30;
  StringPtr message_local;
  
  message_local.content.size_ = message.content.size_;
  message_local.content.ptr = message.content.ptr;
  endByte_local = endByte;
  startByte_local = startByte;
  kj::
  str<kj::StringPtr&,char_const(&)[3],unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
            ((String *)&local_30,(kj *)&message_local,(StringPtr *)" (",
             (char (*) [3])&startByte_local,(uint *)0x577c88,(char (*) [2])&endByte_local,
             (uint *)0x57889a,(char (*) [3])f.exception);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::String>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
             ,0x26,FAILED,(char *)0x0,"kj::str(message, \" (\", startByte, \":\", endByte, \").\")",
             (String *)&local_30);
  kj::Array<char>::~Array(&local_30);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    KJ_FAIL_REQUIRE(kj::str(message, " (", startByte, ":", endByte, ")."));
  }